

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
          (SmallVector<slang::syntax::TokenOrSyntax,_2UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::TokenOrSyntax>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::TokenOrSyntax>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::TokenOrSyntax>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::TokenOrSyntax>).cap = 2;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::reserve
            (&this->super_SmallVectorBase<slang::syntax::TokenOrSyntax>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }